

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall Js::ScriptContext::InitializeCache(ScriptContext *this)

{
  bool bVar1;
  SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *this_00;
  Cache *pCVar2;
  MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
  *ptr;
  Recycler *pRVar3;
  SourceContextInfo *this_01;
  SRCINFO *pSVar4;
  int local_f4;
  TrackAllocData local_b8;
  SRCINFO *local_90;
  SRCINFO *srcInfo;
  undefined8 local_80;
  TrackAllocData local_78;
  SourceContextInfo *local_50;
  SourceContextInfo *sourceContextInfo;
  undefined8 local_40;
  TrackAllocData local_38;
  ScriptContext *local_10;
  ScriptContext *this_local;
  
  local_10 = this;
  bVar1 = DynamicProfileInfo::NeedProfileInfoList();
  if (bVar1) {
    pRVar3 = GetRecycler(this);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_38,
               (type_info *)&SListBase<Js::DynamicProfileInfo*,Memory::Recycler,RealCount>::typeinfo
               ,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
               ,0x4f8);
    pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_38);
    sourceContextInfo = (SourceContextInfo *)Memory::Recycler::AllocInlined;
    local_40 = 0;
    this_00 = (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)
              new<Memory::Recycler>(0x10,pRVar3,0x43c4b0);
    SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::SListBase(this_00);
    pCVar2 = Cache(this);
    Memory::WriteBarrierPtr<SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>_>::
    operator=(&pCVar2->profileInfoList,this_00);
  }
  pCVar2 = Cache(this);
  Memory::ClearArray<Memory::WriteBarrierPtr<Js::PropertyStringMap>>(pCVar2->propertyStrings,0x50);
  if (DAT_01ec73e0 < 1) {
    local_f4 = 0x10;
  }
  else {
    local_f4 = DAT_01ec73e0;
  }
  ptr = JsUtil::
        MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
        ::New(this->recycler,local_f4);
  pCVar2 = Cache(this);
  Memory::
  WriteBarrierPtr<JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>_>
  ::operator=(&pCVar2->dynamicRegexMap,ptr);
  pRVar3 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_78,(type_info *)&SourceContextInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
             ,0x503);
  pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_78);
  srcInfo = (SRCINFO *)Memory::Recycler::AllocZeroInlined;
  local_80 = 0;
  this_01 = (SourceContextInfo *)new<Memory::Recycler>(0x38,pRVar3,0x744a10);
  SourceContextInfo::SourceContextInfo(this_01);
  this_01->dwHostSourceContext = 0xffffffffffffffff;
  this_01->isHostDynamicDocument = false;
  this_01->sourceContextId = 0xffffffff;
  local_50 = this_01;
  pCVar2 = Cache(this);
  Memory::WriteBarrierPtr<SourceContextInfo>::operator=(&pCVar2->noContextSourceContextInfo,this_01)
  ;
  pRVar3 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_b8,(type_info *)&SRCINFO::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
             ,0x509);
  pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_b8);
  pSVar4 = (SRCINFO *)new<Memory::Recycler>(0x28,pRVar3,0x744a10);
  SRCINFO::SRCINFO(pSVar4);
  local_90 = pSVar4;
  pCVar2 = Cache(this);
  Memory::WriteBarrierPtr<SourceContextInfo>::operator=
            (&local_90->sourceContextInfo,&pCVar2->noContextSourceContextInfo);
  pSVar4 = local_90;
  local_90->moduleID = 0;
  pCVar2 = Cache(this);
  Memory::WriteBarrierPtr<SRCINFO>::operator=(&pCVar2->noContextGlobalSourceInfo,pSVar4);
  return;
}

Assistant:

void ScriptContext::InitializeCache()
    {

#if ENABLE_PROFILE_INFO
#if DBG_DUMP || defined(DYNAMIC_PROFILE_STORAGE) || defined(RUNTIME_DATA_COLLECTION)
        if (DynamicProfileInfo::NeedProfileInfoList())
        {
            this->Cache()->profileInfoList = RecyclerNew(this->GetRecycler(), DynamicProfileInfoList);
        }
#endif
#endif

        ClearArray(this->Cache()->propertyStrings, 80);
        this->Cache()->dynamicRegexMap =
            RegexPatternMruMap::New(
                recycler,
                REGEX_CONFIG_FLAG(DynamicRegexMruListSize) <= 0 ? 16 : REGEX_CONFIG_FLAG(DynamicRegexMruListSize));

        SourceContextInfo* sourceContextInfo = RecyclerNewStructZ(this->GetRecycler(), SourceContextInfo);
        sourceContextInfo->dwHostSourceContext = Js::Constants::NoHostSourceContext;
        sourceContextInfo->isHostDynamicDocument = false;
        sourceContextInfo->sourceContextId = Js::Constants::NoSourceContext;
        this->Cache()->noContextSourceContextInfo = sourceContextInfo;

        SRCINFO* srcInfo = RecyclerNewStructZ(this->GetRecycler(), SRCINFO);
        srcInfo->sourceContextInfo = this->Cache()->noContextSourceContextInfo;
        srcInfo->moduleID = kmodGlobal;
        this->Cache()->noContextGlobalSourceInfo = srcInfo;
    }